

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O3

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::unpack_snorm_4x8
               (NegativeTestContext *ctx)

{
  ShaderType shaderType;
  string shaderSource_00;
  string shaderSource_01;
  string shaderSource_02;
  bool bVar1;
  char *__s;
  long *plVar2;
  size_type *psVar3;
  DataType in_R9D;
  long lVar4;
  string shaderSource;
  undefined8 in_stack_ffffffffffffff18;
  _Alloc_hider _Var5;
  size_type sVar6;
  undefined8 in_stack_ffffffffffffff30;
  undefined8 uVar7;
  allocator<char> local_b9;
  long *local_b8 [2];
  long local_a8 [2];
  long *local_98 [2];
  long local_88 [2];
  long *local_78 [2];
  long local_68 [2];
  long local_58;
  long *local_50 [2];
  long local_40 [2];
  
  _Var5._M_p = &stack0xffffffffffffff30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xffffffffffffff20,"unpackSnorm4x8: Invalid v type.","");
  NegativeTestContext::beginSection(ctx,(string *)&stack0xffffffffffffff20);
  if (_Var5._M_p != &stack0xffffffffffffff30) {
    operator_delete(_Var5._M_p,in_stack_ffffffffffffff30 + 1);
  }
  lVar4 = 0;
  do {
    shaderType = (&NegativeTestShared::(anonymous_namespace)::s_shaders)[lVar4];
    bVar1 = NegativeTestContext::isShaderSupported(ctx,shaderType);
    if (bVar1) {
      __s = glu::getShaderTypeName(shaderType);
      std::__cxx11::string::string<std::allocator<char>>((string *)local_50,__s,&local_b9);
      plVar2 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x1c82f43);
      psVar3 = (size_type *)(plVar2 + 2);
      if ((size_type *)*plVar2 == psVar3) {
        uVar7 = *psVar3;
        _Var5._M_p = &stack0xffffffffffffff30;
      }
      else {
        uVar7 = *psVar3;
        _Var5._M_p = (pointer)*plVar2;
      }
      sVar6 = plVar2[1];
      *plVar2 = (long)psVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      NegativeTestContext::beginSection(ctx,(string *)&stack0xffffffffffffff20);
      if (_Var5._M_p != &stack0xffffffffffffff30) {
        operator_delete(_Var5._M_p,uVar7 + 1);
      }
      local_58 = lVar4;
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      lVar4 = 0;
      do {
        if (lVar4 != 0) {
          NegativeTestShared::(anonymous_namespace)::genShaderSourcePackUnpackNorm4x8_abi_cxx11_
                    ((string *)&stack0xffffffffffffff20,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0xc,
                     *(ShaderFunction *)
                      ((long)deqp::gles3::Functional::ShaderOperatorTests::init()::s_uintTypes +
                      lVar4),in_R9D);
          local_98[0] = local_88;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_98,_Var5._M_p,_Var5._M_p + sVar6);
          shaderSource_00._M_string_length = (size_type)_Var5._M_p;
          shaderSource_00._M_dataplus._M_p = (pointer)in_stack_ffffffffffffff18;
          shaderSource_00.field_2._M_allocated_capacity = sVar6;
          shaderSource_00.field_2._8_8_ = uVar7;
          verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                       (ShaderType)local_98[0],shaderSource_00);
          if (local_98[0] != local_88) {
            operator_delete(local_98[0],local_88[0] + 1);
          }
          if (_Var5._M_p != &stack0xffffffffffffff30) {
            operator_delete(_Var5._M_p,uVar7 + 1);
          }
        }
        lVar4 = lVar4 + 4;
      } while (lVar4 != 0x10);
      lVar4 = 0;
      do {
        NegativeTestShared::(anonymous_namespace)::genShaderSourcePackUnpackNorm4x8_abi_cxx11_
                  ((string *)&stack0xffffffffffffff20,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0xc,
                   *(ShaderFunction *)
                    ((long)deqp::gles2::Performance::ShaderOperatorTests::init()::intTypes + lVar4),
                   in_R9D);
        local_b8[0] = local_a8;
        std::__cxx11::string::_M_construct<char*>((string *)local_b8,_Var5._M_p,_Var5._M_p + sVar6);
        shaderSource_01._M_string_length = (size_type)_Var5._M_p;
        shaderSource_01._M_dataplus._M_p = (pointer)in_stack_ffffffffffffff18;
        shaderSource_01.field_2._M_allocated_capacity = sVar6;
        shaderSource_01.field_2._8_8_ = uVar7;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_b8[0],shaderSource_01);
        if (local_b8[0] != local_a8) {
          operator_delete(local_b8[0],local_a8[0] + 1);
        }
        if (_Var5._M_p != &stack0xffffffffffffff30) {
          operator_delete(_Var5._M_p,uVar7 + 1);
        }
        NegativeTestShared::(anonymous_namespace)::genShaderSourcePackUnpackNorm4x8_abi_cxx11_
                  ((string *)&stack0xffffffffffffff20,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0xc,
                   *(ShaderFunction *)
                    ((long)deqp::gles2::Performance::ShaderOperatorTests::init()::floatTypes + lVar4
                    ),in_R9D);
        local_78[0] = local_68;
        std::__cxx11::string::_M_construct<char*>((string *)local_78,_Var5._M_p,_Var5._M_p + sVar6);
        shaderSource_02._M_string_length = (size_type)_Var5._M_p;
        shaderSource_02._M_dataplus._M_p = (pointer)in_stack_ffffffffffffff18;
        shaderSource_02.field_2._M_allocated_capacity = sVar6;
        shaderSource_02.field_2._8_8_ = uVar7;
        verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                     (ShaderType)local_78[0],shaderSource_02);
        if (local_78[0] != local_68) {
          operator_delete(local_78[0],local_68[0] + 1);
        }
        if (_Var5._M_p != &stack0xffffffffffffff30) {
          operator_delete(_Var5._M_p,uVar7 + 1);
        }
        lVar4 = lVar4 + 4;
      } while (lVar4 != 0x10);
      NegativeTestContext::endSection(ctx);
      lVar4 = local_58;
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 6);
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void unpack_snorm_4x8 (NegativeTestContext& ctx)
{
	DE_ASSERT(DE_LENGTH_OF_ARRAY(s_floatTypes) == DE_LENGTH_OF_ARRAY(s_uintTypes));
	DE_ASSERT(DE_LENGTH_OF_ARRAY(s_floatTypes) == DE_LENGTH_OF_ARRAY(s_intTypes));

	ctx.beginSection("unpackSnorm4x8: Invalid v type.");
	for (int shaderNdx = 0; shaderNdx < DE_LENGTH_OF_ARRAY(s_shaders); ++shaderNdx)
	{
		if (ctx.isShaderSupported(s_shaders[shaderNdx]))
		{
			ctx.beginSection("Verify shader: " + std::string(getShaderTypeName(s_shaders[shaderNdx])));
			for (int dataTypeNdx = 0; dataTypeNdx < DE_LENGTH_OF_ARRAY(s_uintTypes); ++dataTypeNdx)
			{
				if (s_uintTypes[dataTypeNdx] == glu::TYPE_UINT)
					continue;

				const std::string shaderSource(genShaderSourcePackUnpackNorm4x8(ctx, s_shaders[shaderNdx], SHADER_FUNCTION_UNPACK_SNORM_4X8, s_uintTypes[dataTypeNdx]));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			for (int dataTypeNdx = 0; dataTypeNdx < DE_LENGTH_OF_ARRAY(s_intTypes); ++dataTypeNdx)
			{
				{
					const std::string shaderSource(genShaderSourcePackUnpackNorm4x8(ctx, s_shaders[shaderNdx], SHADER_FUNCTION_UNPACK_SNORM_4X8, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourcePackUnpackNorm4x8(ctx, s_shaders[shaderNdx], SHADER_FUNCTION_UNPACK_SNORM_4X8, s_floatTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
			}
			ctx.endSection();
		}
	}
	ctx.endSection();
}